

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall
JetHead::Socket::setSelector(Socket *this,SocketListener *listener,Selector *selector)

{
  this->mListener = listener;
  if (this->mConnected == true) {
    if (this->mSelector != (Selector *)0x0) {
      Selector::removeListener(this->mSelector,this->mFd,&this->super_SelectorListener);
      listener = this->mListener;
    }
    this->mSelector = selector;
    if ((selector != (Selector *)0x0) && (listener != (SocketListener *)0x0)) {
      Selector::addListener(selector,this->mFd,1,&this->super_SelectorListener,0);
      return;
    }
  }
  else {
    this->mSelector = selector;
  }
  return;
}

Assistant:

void Socket::setSelector( SocketListener *listener, Selector *selector )
{
	mListener = listener;
	if ( mConnected )
	{
		if ( mSelector != NULL )
			mSelector->removeListener( mFd, this );
		mSelector = selector;
		if ( mSelector != NULL and mListener != NULL )
		{
			mSelector->addListener( mFd, POLLIN, this );
		}
	}
	else
		mSelector = selector;		
}